

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_ntop.c
# Opt level: O3

char * Curl_inet_ntop(int af,void *src,char *buf,size_t size)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  char *pcVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  char tmp [46];
  ulong local_a8 [8];
  char local_68 [46];
  undefined1 auStack_3a [10];
  
  if (af == 10) {
    local_a8[6] = 0;
    local_a8[7] = 0;
    local_a8[4] = 0;
    local_a8[5] = 0;
    local_a8[2] = 0;
    local_a8[3] = 0;
    local_a8[0] = 0;
    local_a8[1] = 0;
    bVar1 = 0;
    uVar13 = 0;
    do {
      local_a8[uVar13 >> 1 & 0x7fffffff] =
           local_a8[uVar13 >> 1 & 0x7fffffff] |
           (ulong)((uint)*(byte *)((long)src + uVar13) << (~bVar1 & 8));
      uVar13 = uVar13 + 1;
      bVar1 = bVar1 + 8;
    } while (uVar13 != 0x10);
    lVar14 = -1;
    lVar12 = 0;
    lVar9 = 0;
    lVar4 = -1;
    lVar10 = 0;
    do {
      if (local_a8[lVar12] == 0) {
        lVar9 = lVar9 + 1;
        if (lVar14 == -1) {
          lVar9 = 1;
          lVar14 = lVar12;
        }
      }
      else {
        lVar5 = lVar4;
        lVar11 = lVar10;
        if ((lVar14 != -1) && (lVar5 = lVar14, lVar11 = lVar9, lVar9 <= lVar10 && lVar4 != -1)) {
          lVar5 = lVar4;
          lVar11 = lVar10;
        }
        lVar4 = lVar5;
        lVar10 = lVar11;
        lVar14 = -1;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 8);
    if ((lVar14 != -1) && (lVar10 < lVar9 || lVar4 == -1)) {
      lVar4 = lVar14;
      lVar10 = lVar9;
    }
    lVar14 = -1;
    if (1 < lVar10) {
      lVar14 = lVar4;
    }
    if (lVar4 == -1) {
      lVar14 = lVar4;
    }
    pcVar3 = local_68;
    lVar4 = 0;
    do {
      if (((lVar14 == -1) || (lVar4 < lVar14)) || (lVar14 + lVar10 <= lVar4)) {
        if (lVar4 != 0) {
          *pcVar3 = ':';
          pcVar3 = pcVar3 + 1;
          if ((lVar4 == 6 && lVar14 == 0) &&
             ((lVar10 == 6 || ((lVar10 == 5 && (local_a8[5] == 0xffff)))))) {
            pcVar7 = inet_ntop4((uchar *)((long)src + 0xc),pcVar3,
                                (size_t)(auStack_3a + -(long)pcVar3));
            if (pcVar7 == (char *)0x0) goto LAB_0012d34f;
            sVar8 = strlen(pcVar3);
            pcVar3 = pcVar3 + sVar8;
            break;
          }
        }
        iVar2 = curl_msnprintf(pcVar3,5,"%lx",local_a8[lVar4]);
        pcVar3 = pcVar3 + iVar2;
      }
      else if (lVar14 == lVar4) {
        *pcVar3 = ':';
        pcVar3 = pcVar3 + 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    if ((lVar14 != -1) && (lVar14 + lVar10 == 8)) {
      *pcVar3 = ':';
      pcVar3 = pcVar3 + 1;
    }
    *pcVar3 = '\0';
    if (pcVar3 + (1 - (long)local_68) <= size) {
      strcpy(buf,local_68);
      return buf;
    }
LAB_0012d34f:
    piVar6 = __errno_location();
    *piVar6 = 0x1c;
  }
  else {
    if (af == 2) {
      pcVar3 = inet_ntop4((uchar *)src,buf,size);
      return pcVar3;
    }
    piVar6 = __errno_location();
    *piVar6 = 0x61;
  }
  return (char *)0x0;
}

Assistant:

char *Curl_inet_ntop(int af, const void *src, char *buf, size_t size)
{
  switch(af) {
  case AF_INET:
    return inet_ntop4((const unsigned char *)src, buf, size);
#ifdef ENABLE_IPV6
  case AF_INET6:
    return inet_ntop6((const unsigned char *)src, buf, size);
#endif
  default:
    errno = EAFNOSUPPORT;
    return NULL;
  }
}